

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O0

PSemaphore * p_semaphore_new(pchar *name,pint init_val,PSemaphoreAccessMode mode,PError **error)

{
  pboolean pVar1;
  size_t sVar2;
  char *__dest;
  pchar *ppVar3;
  pchar *new_name;
  PSemaphore *ret;
  PError **error_local;
  PSemaphoreAccessMode mode_local;
  pint init_val_local;
  pchar *name_local;
  
  if (name == (pchar *)0x0 || init_val < 0) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    name_local = (pchar *)0x0;
  }
  else {
    name_local = (pchar *)p_malloc0(0x20);
    if ((PSemaphore *)name_local == (PSemaphore *)0x0) {
      p_error_set_error_p(error,0x25c,0,"Failed to allocate memory for semaphore");
      name_local = (pchar *)0x0;
    }
    else {
      sVar2 = strlen(name);
      __dest = (char *)p_malloc0(sVar2 + 0xe);
      if (__dest == (char *)0x0) {
        p_error_set_error_p(error,0x25c,0,"Failed to allocate memory for semaphore");
        p_free(name_local);
        name_local = (pchar *)0x0;
      }
      else {
        strcpy(__dest,name);
        strcat(__dest,"_p_sem_object");
        ppVar3 = p_ipc_get_platform_key(__dest,1);
        ((PSemaphore *)name_local)->platform_key = ppVar3;
        ((PSemaphore *)name_local)->init_val = init_val;
        ((PSemaphore *)name_local)->mode = mode;
        p_free(__dest);
        pVar1 = pp_semaphore_create_handle((PSemaphore *)name_local,error);
        if (pVar1 == 0) {
          p_semaphore_free((PSemaphore *)name_local);
          name_local = (pchar *)0x0;
        }
      }
    }
  }
  return (PSemaphore *)name_local;
}

Assistant:

P_LIB_API PSemaphore *
p_semaphore_new (const pchar		*name,
		 pint			init_val,
		 PSemaphoreAccessMode	mode,
		 PError			**error)
{
	PSemaphore	*ret;
	pchar		*new_name;

	if (P_UNLIKELY (name == NULL || init_val < 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSemaphore))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for semaphore");
		return NULL;
	}

	if (P_UNLIKELY ((new_name = p_malloc0 (strlen (name) + strlen (P_SEM_SUFFIX) + 1)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for semaphore");
		p_free (ret);
		return NULL;
	}

	strcpy (new_name, name);
	strcat (new_name, P_SEM_SUFFIX);

#if defined (P_OS_IRIX) || defined (P_OS_TRU64)
	/* IRIX and Tru64 prefer filename styled IPC names */
	ret->platform_key = p_ipc_get_platform_key (new_name, FALSE);
#else
	ret->platform_key = p_ipc_get_platform_key (new_name, TRUE);
#endif
	ret->init_val = init_val;
	ret->mode = mode;

	p_free (new_name);

	if (P_UNLIKELY (pp_semaphore_create_handle (ret, error) == FALSE)) {
		p_semaphore_free (ret);
		return NULL;
	}

	return ret;
}